

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O2

int xmlValidateNamesValueInternal(xmlDocPtr doc,xmlChar *value)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined8 in_RAX;
  long lVar4;
  xmlChar *cur;
  undefined8 uStack_38;
  int len;
  
  if (value == (xmlChar *)0x0) {
    iVar2 = 0;
  }
  else {
    iVar2 = 0;
    uStack_38 = in_RAX;
    iVar1 = xmlStringCurrentChar((xmlParserCtxtPtr)0x0,value,&len);
    lVar4 = (long)len;
    iVar1 = xmlIsDocNameStartChar(doc,iVar1);
    if (iVar1 != 0) {
      cur = value + lVar4;
      do {
        iVar1 = xmlStringCurrentChar((xmlParserCtxtPtr)0x0,cur,&len);
        cur = cur + len;
        iVar2 = xmlIsDocNameChar(doc,iVar1);
      } while (iVar2 != 0);
      iVar2 = 0;
      while (iVar1 == 0x20) {
        while (iVar1 == 0x20) {
          iVar1 = xmlStringCurrentChar((xmlParserCtxtPtr)0x0,cur,&len);
          cur = cur + len;
        }
        iVar1 = xmlIsDocNameStartChar(doc,iVar1);
        if (iVar1 == 0) {
          return 0;
        }
        do {
          iVar1 = xmlStringCurrentChar((xmlParserCtxtPtr)0x0,cur,&len);
          cur = cur + len;
          iVar3 = xmlIsDocNameChar(doc,iVar1);
        } while (iVar3 != 0);
      }
      if (iVar1 == 0) {
        iVar2 = 1;
      }
    }
  }
  return iVar2;
}

Assistant:

static int
xmlValidateNamesValueInternal(xmlDocPtr doc, const xmlChar *value) {
    const xmlChar *cur;
    int val, len;

    if (value == NULL) return(0);
    cur = value;
    val = xmlStringCurrentChar(NULL, cur, &len);
    cur += len;

    if (!xmlIsDocNameStartChar(doc, val))
	return(0);

    val = xmlStringCurrentChar(NULL, cur, &len);
    cur += len;
    while (xmlIsDocNameChar(doc, val)) {
	val = xmlStringCurrentChar(NULL, cur, &len);
	cur += len;
    }

    /* Should not test IS_BLANK(val) here -- see erratum E20*/
    while (val == 0x20) {
	while (val == 0x20) {
	    val = xmlStringCurrentChar(NULL, cur, &len);
	    cur += len;
	}

	if (!xmlIsDocNameStartChar(doc, val))
	    return(0);

	val = xmlStringCurrentChar(NULL, cur, &len);
	cur += len;

	while (xmlIsDocNameChar(doc, val)) {
	    val = xmlStringCurrentChar(NULL, cur, &len);
	    cur += len;
	}
    }

    if (val != 0) return(0);

    return(1);
}